

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ClearCase::init(ClearCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppDVar1;
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *pMVar2;
  deUint32 *this_00;
  pointer pDVar3;
  pointer pVVar4;
  Context *pCVar5;
  RenderContext *pRVar6;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data_00;
  undefined1 auVar7 [16];
  long lVar8;
  bool bVar9;
  ContextType ctxType;
  int iVar10;
  deUint32 dVar11;
  ShaderProgram *pSVar12;
  undefined4 extraout_var;
  TypedObjectWrapper<(glu::ObjectType)1> *this_01;
  ulong uVar13;
  pointer pDVar14;
  ProgramSources *pPVar15;
  TestLog *pTVar16;
  NotSupportedError *pNVar17;
  TestError *pTVar18;
  bool setBBox;
  bool setBBox_00;
  void *__buf;
  void *__buf_00;
  int triangleNdx;
  bool *pbVar19;
  size_t __n;
  char *pcVar20;
  void *pvVar21;
  undefined1 *this_02;
  ShaderSource *pSVar22;
  undefined1 *this_03;
  pointer pDVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  char *pcVar27;
  float fVar28;
  float fVar29;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  float fVar30;
  float in_stack_fffffffffffffc10;
  float in_stack_fffffffffffffc14;
  undefined1 local_3c0 [40];
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined8 local_378;
  UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_368;
  undefined8 local_358;
  undefined8 local_348;
  long local_330;
  ulong local_328;
  ulong local_320;
  string local_318;
  string local_2f8;
  undefined1 local_2d8 [40];
  string local_2b0;
  string local_290;
  undefined1 local_270 [40];
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  Random rnd;
  
  this_02 = &stack0xfffffffffffffc08;
  this_03 = &stack0xfffffffffffffc08;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar9 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar9) {
    bVar9 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_primitive_bounding_box");
    if (!bVar9) {
      pNVar17 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rnd,"Test requires GL_EXT_primitive_bounding_box extension",
                 (allocator<char> *)&stack0xfffffffffffffc08);
      tcu::NotSupportedError::NotSupportedError(pNVar17,(string *)&rnd);
      __cxa_throw(pNVar17,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if ((this->m_drawTriangles == true) &&
       (bVar9 = glu::ContextInfo::isExtensionSupported
                          (((this->super_TestCase).m_context)->m_contextInfo,
                           "GL_EXT_tessellation_shader"), !bVar9)) {
      pNVar17 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rnd,"Test requires GL_EXT_tessellation_shader extension",
                 (allocator<char> *)&stack0xfffffffffffffc08);
      tcu::NotSupportedError::NotSupportedError(pNVar17,(string *)&rnd);
      __cxa_throw(pNVar17,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pbVar19 = &this->m_drawTriangles;
  rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &rnd.m_rnd.z;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Doing multiple");
  pcVar20 = " scissored";
  pcVar27 = glcts::fixed_sample_locations_values + 1;
  if (this->m_scissoredClear == false) {
    pcVar20 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)this_00,pcVar20);
  std::operator<<((ostream *)this_00," color buffer clears");
  pcVar20 = " and drawing some geometry between them";
  if (*pbVar19 == false) {
    pcVar20 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)this_00,pcVar20);
  std::operator<<((ostream *)this_00,".\n");
  pcVar20 = "Setting scissor area to cover entire viewport.\n";
  if ((this->m_scissoredClear & this->m_fullscreenScissor) == 0) {
    pcVar20 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<((ostream *)this_00,pcVar20);
  std::operator<<((ostream *)this_00,"Rendering with and without setting the bounding box.\n");
  std::operator<<((ostream *)this_00,
                  "Expecting bounding box to have no effect on clears (i.e. results are constant).\n"
                 );
  std::operator<<((ostream *)this_00,"Set bounding box using ");
  pcVar20 = "gl_BoundingBoxEXT output";
  if (this->m_useGlobalState != false) {
    pcVar20 = "PRIMITIVE_BOUNDING_BOX_EXT state";
  }
  std::operator<<((ostream *)this_00,pcVar20);
  std::operator<<((ostream *)this_00,".\n");
  std::operator<<((ostream *)this_00,"Clear color is green with yellowish shades.\n");
  if (*pbVar19 != false) {
    pcVar27 = "Primitive color is yellow with greenish shades.\n";
  }
  std::operator<<((ostream *)this_00,pcVar27);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  pSVar12 = (ShaderProgram *)std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  if (*pbVar19 == true) {
    iVar10 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    dVar11 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus.
                          _M_p);
    deRandom_init(&rnd.m_rnd,dVar11);
    this_01 = (TypedObjectWrapper<(glu::ObjectType)1> *)operator_new(0x18);
    glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
              (this_01,((this->super_TestCase).m_context)->m_renderCtx);
    fVar29 = 0.0;
    fVar30 = 0.0;
    auVar7._4_4_ = in_stack_fffffffffffffc14;
    auVar7._0_4_ = in_stack_fffffffffffffc10;
    auVar7._8_8_ = 0;
    local_330 = CONCAT44(extraout_var,iVar10);
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::assignData(&(this->m_vbo).
                  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                 ,(PtrData<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                   )(auVar7 << 0x40));
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                   *)&stack0xfffffffffffffc08);
    local_1c8 = 0x3e4cccd03fb33333;
    uStack_1c0 = 0;
    uVar26 = 0;
    while (lVar8 = local_330, (int)uVar26 != 0x10) {
      local_320 = uVar26;
      dVar11 = deRandom_getUint32(&rnd.m_rnd);
      local_388 = deRandom_getFloat(&rnd.m_rnd);
      fStack_384 = extraout_XMM0_Db;
      fVar28 = deRandom_getFloat(&rnd.m_rnd);
      fStack_380 = fStack_384 + fStack_384;
      local_388 = local_388 + local_388 + -1.2;
      fStack_384 = fVar28 + fVar28 + -1.2;
      fStack_380 = fStack_380 + 0.0;
      fStack_37c = extraout_XMM0_Db_00 + extraout_XMM0_Db_00 + 0.0;
      local_398 = deRandom_getFloat(&rnd.m_rnd);
      fStack_394 = extraout_XMM0_Db_01;
      fVar28 = deRandom_getFloat(&rnd.m_rnd);
      fStack_390 = fStack_394 * 0.0;
      local_398 = local_398 * 0.8 + 0.2;
      fStack_394 = fVar28 * 0.8 + 0.2;
      fStack_390 = fStack_390 + 0.0;
      fStack_38c = extraout_XMM0_Db_02 * 0.0 + 0.0;
      pDVar14 = (this->m_drawObjects).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar26 = (ulong)((long)(this->m_objectVertices).
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_objectVertices).
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4;
      pDVar23 = (pointer)(ulong)((dVar11 & 3) * 3 + 3);
      if (pDVar14 ==
          (this->m_drawObjects).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pDVar3 = (this->m_drawObjects).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __n = (long)pDVar14 - (long)pDVar3;
        if (__n == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar24 = (long)__n >> 3;
        uVar13 = uVar24;
        if (pDVar14 == pDVar3) {
          uVar13 = 1;
        }
        local_348 = uVar13 + uVar24;
        if (0xffffffffffffffe < local_348) {
          local_348 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar13,uVar24)) {
          local_348 = 0xfffffffffffffff;
        }
        local_358 = pDVar3;
        if (local_348 == 0) {
          pDVar14 = (pointer)0x0;
        }
        else {
          local_378 = pDVar23;
          local_328 = uVar24;
          pDVar14 = (pointer)operator_new(local_348 * 8);
          pDVar23 = local_378;
          uVar24 = local_328;
        }
        pDVar14[uVar24] = (DrawObject)(uVar26 & 0xffffffff | (long)pDVar23 << 0x20);
        if (0 < (long)__n) {
          memmove(pDVar14,local_358,__n);
        }
        local_378 = (pointer)((long)pDVar14 + __n + 8);
        std::
        _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
        ::_M_deallocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                         *)local_358,
                        (pointer)((long)(this->m_drawObjects).
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_358 >> 3),(size_t)local_358);
        (this->m_drawObjects).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
        ._M_impl.super__Vector_impl_data._M_start = pDVar14;
        (this->m_drawObjects).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
        ._M_impl.super__Vector_impl_data._M_finish = local_378;
        (this->m_drawObjects).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar14 + local_348;
      }
      else {
        *pDVar14 = (DrawObject)(uVar26 & 0xffffffff | (long)pDVar23 << 0x20);
        ppDVar1 = &(this->m_drawObjects).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
      }
      local_398 = (local_398 + local_388) - local_388;
      fStack_394 = (fStack_394 + fStack_384) - fStack_384;
      fStack_390 = (fStack_390 + fStack_380) - fStack_380;
      fStack_38c = (fStack_38c + fStack_37c) - fStack_37c;
      fStack_380 = -0.7;
      fStack_37c = 0.9;
      for (iVar10 = 0; iVar10 != (dVar11 & 3) + 1; iVar10 = iVar10 + 1) {
        iVar25 = 3;
        while (bVar9 = iVar25 != 0, iVar25 = iVar25 + -1, bVar9) {
          fVar29 = deRandom_getFloat(&rnd.m_rnd);
          local_358 = (pointer)CONCAT44(extraout_XMM0_Db_03,fVar29);
          fVar29 = deRandom_getFloat(&rnd.m_rnd);
          local_348 = CONCAT44(extraout_XMM0_Db_04,fVar29);
          fVar29 = deRandom_getFloat(&rnd.m_rnd);
          local_378 = (pointer)CONCAT44(extraout_XMM0_Db_05,fVar29);
          fVar28 = deRandom_getFloat(&rnd.m_rnd);
          fVar29 = (float)local_358 * local_398 + local_388;
          fVar30 = (float)local_348 * fStack_394 + fStack_384;
          in_stack_fffffffffffffc10 = (float)local_1c8 * SUB84(local_378,0) + fStack_380;
          in_stack_fffffffffffffc14 = (float)((ulong)local_1c8 >> 0x20) * fVar28 + fStack_37c;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
                     &this->m_objectVertices,(Vector<float,_4> *)&stack0xfffffffffffffc08);
        }
      }
      uVar26 = (ulong)((int)local_320 + 1);
    }
    (**(code **)(local_330 + 0x40))
              (0x8892,(((this->m_vbo).
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                        .m_data.ptr)->super_ObjectWrapper).m_object);
    pVVar4 = (this->m_objectVertices).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (**(code **)(lVar8 + 0x150))
              (0x8892,(long)(*(int *)&(this->m_objectVertices).
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (int)pVVar4) &
                      0xfffffffffffffff0,pVVar4,0x88e4);
    dVar11 = (**(code **)(lVar8 + 0x800))();
    pcVar20 = (char *)0x10df;
    glu::checkError(dVar11,"buffer upload",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x10df);
    pSVar12 = (ShaderProgram *)operator_new(0xd0);
    pCVar5 = (this->super_TestCase).m_context;
    pRVar6 = pCVar5->m_renderCtx;
    pvVar21 = (void *)0x0;
    memset(&rnd,0,0xac);
    Functional::(anonymous_namespace)::ClearCase::genVertexSource_abi_cxx11_(&local_208,pvVar21);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_1e8,(_anonymous_namespace_ *)pCVar5,(Context *)local_208._M_dataplus._M_p,
               pcVar20);
    glu::VertexSource::VertexSource((VertexSource *)&stack0xfffffffffffffc08,&local_1e8);
    pPVar15 = glu::ProgramSources::operator<<
                        ((ProgramSources *)&rnd,(ShaderSource *)&stack0xfffffffffffffc08);
    pCVar5 = (this->super_TestCase).m_context;
    Functional::(anonymous_namespace)::ClearCase::genFragmentSource_abi_cxx11_(&local_248,this_02);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_228,(_anonymous_namespace_ *)pCVar5,(Context *)local_248._M_dataplus._M_p,
               pcVar20);
    glu::FragmentSource::FragmentSource((FragmentSource *)local_3c0,&local_228);
    pPVar15 = glu::ProgramSources::operator<<(pPVar15,(ShaderSource *)local_3c0);
    pCVar5 = (this->super_TestCase).m_context;
    Functional::(anonymous_namespace)::ClearCase::genTessellationControlSource_abi_cxx11_
              (&local_2b0,(void *)0x0,setBBox);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_290,(_anonymous_namespace_ *)pCVar5,(Context *)local_2b0._M_dataplus._M_p,
               pcVar20);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)local_270,&local_290);
    pSVar22 = (ShaderSource *)local_270;
    pPVar15 = glu::ProgramSources::operator<<(pPVar15,pSVar22);
    pCVar5 = (this->super_TestCase).m_context;
    Functional::(anonymous_namespace)::ClearCase::genTessellationEvaluationSource_abi_cxx11_
              (&local_318,pSVar22);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2f8,(_anonymous_namespace_ *)pCVar5,(Context *)local_318._M_dataplus._M_p,
               pcVar20);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_2d8,&local_2f8);
    pPVar15 = glu::ProgramSources::operator<<(pPVar15,(ShaderSource *)local_2d8);
    glu::ShaderProgram::ShaderProgram(pSVar12,pRVar6,pPVar15);
    local_368.m_data.ptr = (ShaderProgram *)0x0;
    pMVar2 = &this->m_basicProgram;
    data.ptr._4_4_ = fVar30;
    data.ptr._0_4_ = fVar29;
    data._8_4_ = in_stack_fffffffffffffc10;
    data._12_4_ = in_stack_fffffffffffffc14;
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::assignData
              (&pMVar2->
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>,data);
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
    ~UniqueBase(&local_368);
    std::__cxx11::string::~string((string *)(local_2d8 + 8));
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)(local_270 + 8));
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)(local_3c0 + 8));
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc10);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    glu::ProgramSources::~ProgramSources((ProgramSources *)&rnd);
    pTVar16 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffc08,"Program",(allocator<char> *)local_270);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3c0,"Shader program",(allocator<char> *)local_2d8);
    tcu::LogSection::LogSection
              ((LogSection *)&rnd,(string *)&stack0xfffffffffffffc08,(string *)local_3c0);
    tcu::LogSection::write((LogSection *)&rnd,(int)pTVar16,__buf,(size_t)pcVar20);
    pTVar16 = glu::operator<<(pTVar16,(pMVar2->
                                      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                      ).m_data.ptr);
    tcu::TestLog::endSection(pTVar16);
    tcu::LogSection::~LogSection((LogSection *)&rnd);
    std::__cxx11::string::~string((string *)local_3c0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc08);
    pSVar12 = (pMVar2->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
              ).m_data.ptr;
    if ((pSVar12->m_program).m_info.linkOk == false) {
      pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rnd,"shader build failed",(allocator<char> *)&stack0xfffffffffffffc08);
      tcu::TestError::TestError(pTVar18,(string *)&rnd);
      __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (this->m_useGlobalState == false) {
      pSVar12 = (ShaderProgram *)operator_new(0xd0);
      pCVar5 = (this->super_TestCase).m_context;
      pRVar6 = pCVar5->m_renderCtx;
      pvVar21 = (void *)0x0;
      memset(&rnd,0,0xac);
      Functional::(anonymous_namespace)::ClearCase::genVertexSource_abi_cxx11_(&local_208,pvVar21);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_1e8,(_anonymous_namespace_ *)pCVar5,(Context *)local_208._M_dataplus._M_p,
                 pcVar20);
      glu::VertexSource::VertexSource((VertexSource *)&stack0xfffffffffffffc08,&local_1e8);
      pPVar15 = glu::ProgramSources::operator<<
                          ((ProgramSources *)&rnd,(ShaderSource *)&stack0xfffffffffffffc08);
      pCVar5 = (this->super_TestCase).m_context;
      Functional::(anonymous_namespace)::ClearCase::genFragmentSource_abi_cxx11_(&local_248,this_03)
      ;
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_228,(_anonymous_namespace_ *)pCVar5,(Context *)local_248._M_dataplus._M_p,
                 pcVar20);
      glu::FragmentSource::FragmentSource((FragmentSource *)local_3c0,&local_228);
      pPVar15 = glu::ProgramSources::operator<<(pPVar15,(ShaderSource *)local_3c0);
      pCVar5 = (this->super_TestCase).m_context;
      Functional::(anonymous_namespace)::ClearCase::genTessellationControlSource_abi_cxx11_
                (&local_2b0,&DAT_00000001,setBBox_00);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_290,(_anonymous_namespace_ *)pCVar5,(Context *)local_2b0._M_dataplus._M_p,
                 pcVar20);
      glu::TessellationControlSource::TessellationControlSource
                ((TessellationControlSource *)local_270,&local_290);
      pSVar22 = (ShaderSource *)local_270;
      pPVar15 = glu::ProgramSources::operator<<(pPVar15,pSVar22);
      pCVar5 = (this->super_TestCase).m_context;
      Functional::(anonymous_namespace)::ClearCase::genTessellationEvaluationSource_abi_cxx11_
                (&local_318,pSVar22);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2f8,(_anonymous_namespace_ *)pCVar5,(Context *)local_318._M_dataplus._M_p,
                 pcVar20);
      glu::TessellationEvaluationSource::TessellationEvaluationSource
                ((TessellationEvaluationSource *)local_2d8,&local_2f8);
      pPVar15 = glu::ProgramSources::operator<<(pPVar15,(ShaderSource *)local_2d8);
      glu::ShaderProgram::ShaderProgram(pSVar12,pRVar6,pPVar15);
      local_368.m_data.ptr = (ShaderProgram *)0x0;
      pMVar2 = &this->m_perPrimitiveProgram;
      data_00.ptr._4_4_ = fVar30;
      data_00.ptr._0_4_ = fVar29;
      data_00._8_4_ = in_stack_fffffffffffffc10;
      data_00._12_4_ = in_stack_fffffffffffffc14;
      de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
      assignData(&pMVar2->
                  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>,
                 data_00);
      de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
      ~UniqueBase(&local_368);
      std::__cxx11::string::~string((string *)(local_2d8 + 8));
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)(local_270 + 8));
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)(local_3c0 + 8));
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffc10);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      glu::ProgramSources::~ProgramSources((ProgramSources *)&rnd);
      pTVar16 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffc08,"PerPrimitiveProgram",
                 (allocator<char> *)local_270);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3c0,"Shader program that sets the bounding box",
                 (allocator<char> *)local_2d8);
      tcu::LogSection::LogSection
                ((LogSection *)&rnd,(string *)&stack0xfffffffffffffc08,(string *)local_3c0);
      tcu::LogSection::write((LogSection *)&rnd,(int)pTVar16,__buf_00,(size_t)pcVar20);
      pTVar16 = glu::operator<<(pTVar16,(pMVar2->
                                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                        ).m_data.ptr);
      tcu::TestLog::endSection(pTVar16);
      tcu::LogSection::~LogSection((LogSection *)&rnd);
      std::__cxx11::string::~string((string *)local_3c0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffc08);
      pSVar12 = (pMVar2->
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
                m_data.ptr;
      if ((pSVar12->m_program).m_info.linkOk == false) {
        pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&rnd,"shader build failed",(allocator<char> *)&stack0xfffffffffffffc08)
        ;
        tcu::TestError::TestError(pTVar18,(string *)&rnd);
        __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  return (int)pSVar12;
}

Assistant:

void ClearCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (m_drawTriangles && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Doing multiple"
			<< ((m_scissoredClear) ? (" scissored") : (""))
			<< " color buffer clears"
			<< ((m_drawTriangles) ? (" and drawing some geometry between them") : (""))
			<< ".\n"
		<< ((m_scissoredClear && m_fullscreenScissor) ? ("Setting scissor area to cover entire viewport.\n") : (""))
		<< "Rendering with and without setting the bounding box.\n"
		<< "Expecting bounding box to have no effect on clears (i.e. results are constant).\n"
		<< "Set bounding box using "
			<< ((m_useGlobalState) ? ("PRIMITIVE_BOUNDING_BOX_EXT state") : ("gl_BoundingBoxEXT output"))
			<< ".\n"
		<< "Clear color is green with yellowish shades.\n"
		<< ((m_drawTriangles) ? ("Primitive color is yellow with greenish shades.\n") : (""))
		<< tcu::TestLog::EndMessage;

	if (m_drawTriangles)
	{
		createVbo();
		createProgram();
	}
}